

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fxstore(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  uint in_EAX;
  uint uVar2;
  int iVar3;
  uint uVar4;
  x86Op xo;
  RegSet RVar5;
  ulong uStack_28;
  int32_t k;
  
  uStack_28 = (ulong)in_EAX;
  if ((ir->field_1).r != 0xfe) {
    uVar4 = (ir->field_1).t.irt & 0x1f;
    if (((uVar4 < 0x13) && ((0x66000U >> uVar4 & 1) != 0)) ||
       (iVar3 = asm_isk32(as,(uint)(ir->field_0).op2,&k), iVar3 == 0)) {
      RVar5 = 0xffff0000;
      if (1 < (byte)((char)uVar4 - 0xdU)) {
        RVar5 = 0xbfef;
      }
      uVar4 = ra_alloc1(as,(uint)(ir->field_0).op2,RVar5);
      RVar5 = ~(1 << (uVar4 & 0x1f)) & 0xbfef;
    }
    else {
      RVar5 = 0xbfef;
      uVar4 = 0x80;
    }
    if ((ir->field_1).o == 'M') {
      asm_fusefref(as,as->ir + (ir->field_0).op1,RVar5);
    }
    else {
      asm_fusexref(as,(uint)(ir->field_0).op1,RVar5);
    }
    uVar2 = (ir->field_1).t.irt & 0x1f;
    if (uVar4 < 0x80) {
      switch(uVar2) {
      case 0xd:
        xo = XO_MOVSSto;
        break;
      case 0xe:
        xo = XO_MOVSDto;
        break;
      case 0xf:
      case 0x10:
        uVar4 = uVar4 | 0x200;
        xo = XO_MOVtob;
        break;
      case 0x11:
      case 0x12:
        xo = XO_MOVtow;
        break;
      default:
        if ((0x605fd9U >> uVar2 & 1) != 0) {
          uVar4 = uVar4 | 0x80200;
        }
        xo = XO_MOVto;
      }
    }
    else if ((byte)((char)uVar2 - 0xfU) < 2) {
      pMVar1 = as->mcp;
      as->mcp = pMVar1 + -1;
      pMVar1[-1] = (MCode)(uStack_28 >> 0x20);
      xo = XO_MOVmib;
      uVar4 = 0;
    }
    else {
      pMVar1 = as->mcp;
      *(int32_t *)(pMVar1 + -4) = k;
      as->mcp = pMVar1 + -4;
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      uVar4 = -(uint)((0x605fd9U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200;
      xo = XO_MOVmi;
    }
    emit_mrm(as,xo,uVar4,0x20);
    return;
  }
  return;
}

Assistant:

static void asm_fxstore(ASMState *as, IRIns *ir)
{
  RegSet allow = RSET_GPR;
  Reg src = RID_NONE, osrc = RID_NONE;
  int32_t k = 0;
  if (ir->r == RID_SINK)
    return;
  /* The IRT_I16/IRT_U16 stores should never be simplified for constant
  ** values since mov word [mem], imm16 has a length-changing prefix.
  */
  if (irt_isi16(ir->t) || irt_isu16(ir->t) || irt_isfp(ir->t) ||
      !asm_isk32(as, ir->op2, &k)) {
    RegSet allow8 = irt_isfp(ir->t) ? RSET_FPR :
		    (irt_isi8(ir->t) || irt_isu8(ir->t)) ? RSET_GPR8 : RSET_GPR;
    src = osrc = ra_alloc1(as, ir->op2, allow8);
    if (!LJ_64 && !rset_test(allow8, src)) {  /* Already in wrong register. */
      rset_clear(allow, osrc);
      src = ra_scratch(as, allow8);
    }
    rset_clear(allow, src);
  }
  if (ir->o == IR_FSTORE) {
    asm_fusefref(as, IR(ir->op1), allow);
  } else {
    asm_fusexref(as, ir->op1, allow);
    if (LJ_32 && ir->o == IR_HIOP) as->mrm.ofs += 4;
  }
  if (ra_hasreg(src)) {
    x86Op xo;
    switch (irt_type(ir->t)) {
    case IRT_I8: case IRT_U8: xo = XO_MOVtob; src |= FORCE_REX; break;
    case IRT_I16: case IRT_U16: xo = XO_MOVtow; break;
    case IRT_NUM: xo = XO_MOVSDto; break;
    case IRT_FLOAT: xo = XO_MOVSSto; break;
#if LJ_64 && !LJ_GC64
    case IRT_LIGHTUD:
      /* NYI: mask 64 bit lightuserdata. */
      lj_assertA(0, "store of lightuserdata");
#endif
    default:
      if (LJ_64 && irt_is64(ir->t))
	src |= REX_64;
      else
	lj_assertA(irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t),
		   "unsplit 64 bit store");
      xo = XO_MOVto;
      break;
    }
    emit_mrm(as, xo, src, RID_MRM);
    if (!LJ_64 && src != osrc) {
      ra_noweak(as, osrc);
      emit_rr(as, XO_MOV, src, osrc);
    }
  } else {
    if (irt_isi8(ir->t) || irt_isu8(ir->t)) {
      emit_i8(as, k);
      emit_mrm(as, XO_MOVmib, 0, RID_MRM);
    } else {
      lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) || irt_isu32(ir->t) ||
		 irt_isaddr(ir->t), "bad store type");
      emit_i32(as, k);
      emit_mrm(as, XO_MOVmi, REX_64IR(ir, 0), RID_MRM);
    }
  }
}